

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

value * __thiscall mjs::object::get(value *__return_storage_ptr__,object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute a;
  property *this_00;
  object *this_01;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar2;
  gc_heap_ptr_untracked<mjs::object,_true> local_2c;
  
  pVar2 = find(this,*name);
  this_00 = pVar2.first;
  if (this_00 == (property *)0x0) {
    this_01 = this;
    do {
      local_2c.pos_ = (this_01->prototype_).pos_;
      if (local_2c.pos_ == 0) {
        value::value(__return_storage_ptr__,(value *)&value::undefined);
        return __return_storage_ptr__;
      }
      this_01 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&local_2c,this->heap_);
      pVar2 = find(this_01,*name);
      this_00 = pVar2.first;
      if (this_00 != (property *)0x0) goto LAB_00149eca;
      a = (*this_01->_vptr_object[6])(this_01,name,pVar2.second);
      bVar1 = is_valid(a);
    } while (!bVar1);
    (**this_01->_vptr_object)(__return_storage_ptr__,this_01,name);
  }
  else {
LAB_00149eca:
    property::get(__return_storage_ptr__,this_00,this);
  }
  return __return_storage_ptr__;
}

Assistant:

value object::get(const std::wstring_view& name) const {
    if (auto it = find(name).first) {
        return it->get(*this);
    }
    for (auto p = prototype_; p; ) {
        auto& proto = p.dereference(heap());
        if (auto it = proto.find(name).first) {
            return it->get(*this);
        } else if (is_valid(proto.own_property_attributes(name))) {
            return proto.get(name);
        }
        p = proto.prototype_;
    }

    return value::undefined;
}